

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O2

Gia_Man_t * Abc_NtkClpGia(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  uint uVar4;
  Gia_Man_t *pNew;
  char *pcVar5;
  Abc_Obj_t *pAVar6;
  Gia_Obj_t *pGVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  uint v;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcCollapse.c"
                  ,0x243,"Gia_Man_t *Abc_NtkClpGia(Abc_Ntk_t *)");
  }
  pNew = Gia_ManStart(1000);
  pcVar5 = Abc_UtilStrsav(pNtk->pName);
  pNew->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(pNtk->pSpec);
  pNew->pSpec = pcVar5;
  for (iVar9 = 0; iVar9 < pNtk->vObjs->nSize; iVar9 = iVar9 + 1) {
    pAVar6 = Abc_NtkObj(pNtk,iVar9);
    if (pAVar6 != (Abc_Obj_t *)0x0) {
      (pAVar6->field_6).iTemp = -1;
    }
  }
  pAVar6 = Abc_AigConst1(pNtk);
  (pAVar6->field_6).iTemp = 1;
  for (iVar9 = 0; iVar9 < pNtk->vCis->nSize; iVar9 = iVar9 + 1) {
    pAVar6 = Abc_NtkCi(pNtk,iVar9);
    pGVar7 = Gia_ManAppendObj(pNew);
    uVar1 = *(ulong *)pGVar7;
    *(ulong *)pGVar7 = uVar1 | 0x9fffffff;
    *(ulong *)pGVar7 =
         uVar1 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(pNew->vCis->nSize & 0x1fffffff) << 0x20;
    pVVar2 = pNew->vCis;
    iVar3 = Gia_ObjId(pNew,pGVar7);
    Vec_IntPush(pVVar2,iVar3);
    iVar3 = Gia_ObjId(pNew,pGVar7);
    (pAVar6->field_6).iTemp = iVar3 * 2;
  }
  iVar9 = 0;
  while( true ) {
    if (pNtk->vCos->nSize <= iVar9) {
      return pNew;
    }
    pAVar6 = Abc_NtkCo(pNtk,iVar9);
    iVar3 = Abc_NtkClpGia_rec(pNew,(Abc_Obj_t *)
                                   pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray]);
    uVar4 = Abc_LitNotCond(iVar3,*(uint *)&pAVar6->field_0x14 >> 10 & 1);
    v = uVar4 >> 1;
    if (pNew->nObjs <= (int)v) break;
    pGVar7 = Gia_ManObj(pNew,v);
    if ((~*(uint *)pGVar7 & 0x1fffffff) != 0 && (int)*(uint *)pGVar7 < 0) {
      __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    pGVar7 = Gia_ManAppendObj(pNew);
    *(ulong *)pGVar7 = *(ulong *)pGVar7 | 0x80000000;
    iVar3 = Gia_ObjId(pNew,pGVar7);
    uVar8 = (ulong)(iVar3 - v & 0x1fffffff);
    uVar1 = *(ulong *)pGVar7;
    uVar10 = (ulong)((uVar4 & 1) << 0x1d);
    *(ulong *)pGVar7 = uVar10 | uVar1 & 0xffffffffc0000000 | uVar8;
    *(ulong *)pGVar7 =
         uVar10 | uVar1 & 0xe0000000c0000000 | uVar8 |
         (ulong)(pNew->vCos->nSize & 0x1fffffff) << 0x20;
    pVVar2 = pNew->vCos;
    iVar3 = Gia_ObjId(pNew,pGVar7);
    Vec_IntPush(pVVar2,iVar3);
    if (pNew->pFanData != (int *)0x0) {
      Gia_ObjAddFanout(pNew,pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff),pGVar7);
    }
    Gia_ObjId(pNew,pGVar7);
    iVar9 = iVar9 + 1;
  }
  __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
}

Assistant:

Gia_Man_t * Abc_NtkClpGia( Abc_Ntk_t * pNtk )
{
    int i, iLit;
    Gia_Man_t * pNew;
    Abc_Obj_t * pNode;
    assert( Abc_NtkIsStrash(pNtk) );
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( pNtk->pName );
    pNew->pSpec = Abc_UtilStrsav( pNtk->pSpec );
    Abc_NtkForEachObj( pNtk, pNode, i )
        pNode->iTemp = -1;
    Abc_AigConst1(pNtk)->iTemp = 1;
    Abc_NtkForEachCi( pNtk, pNode, i )
        pNode->iTemp = Gia_ManAppendCi(pNew);
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        iLit = Abc_NtkClpGia_rec( pNew, Abc_ObjFanin0(pNode) );
        iLit = Abc_LitNotCond( iLit, Abc_ObjFaninC0(pNode) );
        Gia_ManAppendCo( pNew, iLit );
    }
    return pNew;
}